

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O0

BVIndex __thiscall BVStatic<256UL>::Count(BVStatic<256UL> *this)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined8 *in_FS_OFFSET;
  uint local_18;
  uint local_14;
  BVIndex i;
  BVIndex sum;
  BVStatic<256UL> *this_local;
  
  local_14 = 0;
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    BVar3 = BVUnitT<unsigned_long>::Count(this->data + local_18);
    local_14 = BVar3 + local_14;
  }
  if (0x100 < local_14) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                       ,0x1f6,"(sum <= bitCount)","sum <= bitCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  return local_14;
}

Assistant:

BVIndex Count() const
    {
        BVIndex sum = 0;
        for (BVIndex i = 0; i < wordCount; i++)
        {
            sum += this->data[i].Count();
        }

        Assert(sum <= bitCount);
        return sum;
    }